

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodePtr xmlXPathNextDescendantOrSelf(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlNodePtr pxVar1;
  
  if ((ctxt != (xmlXPathParserContextPtr)0x0) && (ctxt->context != (xmlXPathContextPtr)0x0)) {
    pxVar1 = ctxt->context->node;
    if (cur == (xmlNodePtr)0x0) {
      return pxVar1;
    }
    if ((pxVar1 != (xmlNodePtr)0x0) && ((pxVar1->type | XML_ATTRIBUTE_DECL) != XML_NAMESPACE_DECL))
    {
      pxVar1 = xmlXPathNextDescendant(ctxt,cur);
      return pxVar1;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlXPathNextDescendantOrSelf(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (cur == NULL)
        return(ctxt->context->node);

    if (ctxt->context->node == NULL)
        return(NULL);
    if ((ctxt->context->node->type == XML_ATTRIBUTE_NODE) ||
        (ctxt->context->node->type == XML_NAMESPACE_DECL))
        return(NULL);

    return(xmlXPathNextDescendant(ctxt, cur));
}